

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
::find<google::protobuf::(anonymous_namespace)::ParentNumberQuery>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
           *this,key_arg<google::protobuf::(anonymous_namespace)::ParentNumberQuery> *key)

{
  size_t *psVar1;
  ctrl_t *pcVar2;
  undefined1 (*pauVar3) [16];
  undefined1 auVar4 [16];
  bool bVar5;
  uint32_t uVar6;
  ParentNumberQuery *t;
  undefined1 (*pauVar7) [16];
  size_t sVar8;
  ctrl_t *pcVar9;
  size_t *psVar10;
  slot_type *ppEVar11;
  slot_type *slot;
  slot_type *slot_00;
  slot_type *slot_01;
  ulong extraout_RDX;
  ulong uVar12;
  ushort uVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  __m128i match;
  ctrl_t cVar16;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  undefined1 auVar17 [16];
  iterator iVar33;
  anon_class_24_3_2b146c49 assert_consistent;
  size_t hash_of_arg;
  anon_class_24_3_2b146c49 local_98;
  GroupPortableImpl local_80;
  undefined1 local_78 [16];
  ParentNumberHash *local_68;
  anon_class_24_3_2b146c49 local_60;
  ctrl_t local_48;
  ctrl_t cStack_47;
  ctrl_t cStack_46;
  ctrl_t cStack_45;
  ctrl_t cStack_44;
  ctrl_t cStack_43;
  ctrl_t cStack_42;
  ctrl_t cStack_41;
  ctrl_t cStack_40;
  ctrl_t cStack_3f;
  ctrl_t cStack_3e;
  ctrl_t cStack_3d;
  ctrl_t cStack_3c;
  ctrl_t cStack_3b;
  ctrl_t cStack_3a;
  ctrl_t cStack_39;
  size_t local_38;
  
  t = key;
  bVar5 = empty(this);
  if (!bVar5) {
    local_38 = google::protobuf::(anonymous_namespace)::ParentNumberHash::operator()
                         ((ParentNumberHash *)key,t);
    local_60.hash_of_arg = &local_38;
    local_60.key = key;
    local_60.this = this;
    bVar5 = is_soo(this);
    if (bVar5) {
      t = (ParentNumberQuery *)soo_slot(this);
      AssertHashEqConsistent<google::protobuf::(anonymous_namespace)::ParentNumberQuery>::
      anon_class_24_3_2b146c49::operator()(&local_60,(ctrl_t *)t,slot);
    }
    else {
      sVar8 = capacity(this);
      if (sVar8 < 0x11) {
        ppEVar11 = slot_array(this);
        local_98.hash_of_arg = local_60.hash_of_arg;
        local_98.key = local_60.key;
        local_98.this = local_60.this;
        uVar12 = (this->settings_).
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        pauVar3 = (undefined1 (*) [16])
                  (this->settings_).
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.heap_or_soo_.heap.control;
        local_68 = (ParentNumberHash *)key;
        if (uVar12 < 0xf) {
          if (8 < uVar12) {
            __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x78b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::EnumValueDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
          local_80.ctrl = *(uint64_t *)(*pauVar3 + uVar12);
          for (local_80.ctrl = (uint64_t)GroupPortableImpl::MaskFull(&local_80);
              key = (key_arg<google::protobuf::(anonymous_namespace)::ParentNumberQuery> *)local_68,
              local_80.ctrl != 0; local_80.ctrl = local_80.ctrl - 1 & local_80.ctrl) {
            uVar6 = NonIterableBitMask<unsigned_long,_8,_3>::LowestBitSet
                              ((NonIterableBitMask<unsigned_long,_8,_3> *)&local_80);
            t = (ParentNumberQuery *)(ppEVar11 + ((ulong)uVar6 - 1));
            AssertHashEqConsistent<google::protobuf::(anonymous_namespace)::ParentNumberQuery>::
            anon_class_24_3_2b146c49::operator()(&local_98,(ctrl_t *)t,slot_00);
          }
        }
        else {
          uVar12 = (this->settings_).
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.size_ >> 1;
          local_78._0_8_ = uVar12;
          while (pauVar7 = pauVar3, uVar12 != 0) {
            auVar15 = *pauVar7;
            for (uVar13 = ~((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar15[0xf] >> 7) << 0xf); uVar13 != 0;
                uVar13 = uVar13 - 1 & uVar13) {
              uVar6 = TrailingZeros<unsigned_short>(uVar13);
              if ((char)(*pauVar7)[uVar6] < '\0') {
                __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x79d,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::EnumValueDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                             );
              }
              t = (ParentNumberQuery *)(ppEVar11 + uVar6);
              AssertHashEqConsistent<google::protobuf::(anonymous_namespace)::ParentNumberQuery>::
              anon_class_24_3_2b146c49::operator()(&local_98,(ctrl_t *)t,slot_01);
              uVar12 = uVar12 - 1;
            }
            ppEVar11 = ppEVar11 + 0x10;
            pauVar3 = pauVar7 + 1;
            if ((uVar12 != 0) && ((*pauVar7)[0xf] == -1)) {
              __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7a5,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::EnumValueDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                           );
            }
          }
          key = (key_arg<google::protobuf::(anonymous_namespace)::ParentNumberQuery> *)local_68;
          if ((ulong)local_78._0_8_ <
              (this->settings_).
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .size_ >> 1) {
            __assert_fail("(original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7aa,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::EnumValueDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
        }
      }
    }
  }
  AssertNotDebugCapacity(this);
  bVar5 = is_soo(this);
  if (bVar5) {
    bVar5 = is_soo(this);
    if (!bVar5) {
      __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe21,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>, K = google::protobuf::(anonymous namespace)::ParentNumberQuery]"
                   );
    }
    bVar5 = empty(this);
    if (!bVar5) {
      ppEVar11 = soo_slot(this);
      if (((*ppEVar11)->type_ == *(EnumDescriptor **)key) &&
         ((*ppEVar11)->number_ == *(int *)((long)key + 8))) {
        iVar33 = soo_iterator(this);
        return iVar33;
      }
    }
  }
  else {
    prefetch_heap_block(this);
    sVar8 = google::protobuf::(anonymous_namespace)::ParentNumberHash::operator()
                      ((ParentNumberHash *)key,t);
    bVar5 = is_soo(this);
    if (bVar5) {
      __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe2a,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>, K = google::protobuf::(anonymous namespace)::ParentNumberQuery]"
                   );
    }
    probe((probe_seq<16UL> *)&local_98,(CommonFields *)this,sVar8);
    pcVar9 = control(this);
    auVar15 = ZEXT216(CONCAT11((char)sVar8,(char)sVar8) & 0x7f7f);
    auVar15 = pshuflw(auVar15,auVar15,0);
    uVar14 = auVar15._0_4_;
    local_78._4_4_ = uVar14;
    local_78._0_4_ = uVar14;
    local_78._8_4_ = uVar14;
    local_78._12_4_ = uVar14;
    while( true ) {
      pcVar2 = pcVar9 + (long)local_98.this;
      auVar15[0] = -(local_78[0] == *pcVar2);
      auVar15[1] = -(local_78[1] == pcVar2[1]);
      auVar15[2] = -(local_78[2] == pcVar2[2]);
      auVar15[3] = -(local_78[3] == pcVar2[3]);
      auVar15[4] = -(local_78[4] == pcVar2[4]);
      auVar15[5] = -(local_78[5] == pcVar2[5]);
      auVar15[6] = -(local_78[6] == pcVar2[6]);
      auVar15[7] = -(local_78[7] == pcVar2[7]);
      auVar15[8] = -(local_78[8] == pcVar2[8]);
      auVar15[9] = -(local_78[9] == pcVar2[9]);
      auVar15[10] = -(local_78[10] == pcVar2[10]);
      auVar15[0xb] = -(local_78[0xb] == pcVar2[0xb]);
      auVar15[0xc] = -(local_78[0xc] == pcVar2[0xc]);
      auVar15[0xd] = -(local_78[0xd] == pcVar2[0xd]);
      auVar15[0xe] = -(local_78[0xe] == pcVar2[0xe]);
      auVar15[0xf] = -(local_78[0xf] == pcVar2[0xf]);
      cVar16 = *pcVar2;
      cVar18 = pcVar2[1];
      cVar19 = pcVar2[2];
      cVar20 = pcVar2[3];
      cVar21 = pcVar2[4];
      cVar22 = pcVar2[5];
      cVar23 = pcVar2[6];
      cVar24 = pcVar2[7];
      cVar25 = pcVar2[8];
      cVar26 = pcVar2[9];
      cVar27 = pcVar2[10];
      cVar28 = pcVar2[0xb];
      cVar29 = pcVar2[0xc];
      cVar30 = pcVar2[0xd];
      cVar31 = pcVar2[0xe];
      cVar32 = pcVar2[0xf];
      for (uVar13 = (ushort)(SUB161(auVar15 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar15[0xf] >> 7) << 0xf; uVar13 != 0; uVar13 = uVar13 - 1 & uVar13) {
        local_48 = cVar16;
        cStack_47 = cVar18;
        cStack_46 = cVar19;
        cStack_45 = cVar20;
        cStack_44 = cVar21;
        cStack_43 = cVar22;
        cStack_42 = cVar23;
        cStack_41 = cVar24;
        cStack_40 = cVar25;
        cStack_3f = cVar26;
        cStack_3e = cVar27;
        cStack_3d = cVar28;
        cStack_3c = cVar29;
        cStack_3b = cVar30;
        cStack_3a = cVar31;
        cStack_39 = cVar32;
        uVar6 = TrailingZeros<unsigned_short>(uVar13);
        ppEVar11 = slot_array(this);
        uVar12 = (long)&((local_98.this)->settings_).
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.capacity_ + (ulong)uVar6 & (ulong)local_98.key;
        if ((ppEVar11[uVar12]->type_ == *(EnumDescriptor **)key) &&
           (ppEVar11[uVar12]->number_ == *(int *)((long)key + 8))) {
          iVar33 = iterator_at(this,uVar12);
          return iVar33;
        }
        cVar16 = local_48;
        cVar18 = cStack_47;
        cVar19 = cStack_46;
        cVar20 = cStack_45;
        cVar21 = cStack_44;
        cVar22 = cStack_43;
        cVar23 = cStack_42;
        cVar24 = cStack_41;
        cVar25 = cStack_40;
        cVar26 = cStack_3f;
        cVar27 = cStack_3e;
        cVar28 = cStack_3d;
        cVar29 = cStack_3c;
        cVar30 = cStack_3b;
        cVar31 = cStack_3a;
        cVar32 = cStack_39;
      }
      auVar17[0] = -(cVar16 == kEmpty);
      auVar17[1] = -(cVar18 == kEmpty);
      auVar17[2] = -(cVar19 == kEmpty);
      auVar17[3] = -(cVar20 == kEmpty);
      auVar17[4] = -(cVar21 == kEmpty);
      auVar17[5] = -(cVar22 == kEmpty);
      auVar17[6] = -(cVar23 == kEmpty);
      auVar17[7] = -(cVar24 == kEmpty);
      auVar17[8] = -(cVar25 == kEmpty);
      auVar17[9] = -(cVar26 == kEmpty);
      auVar17[10] = -(cVar27 == kEmpty);
      auVar17[0xb] = -(cVar28 == kEmpty);
      auVar17[0xc] = -(cVar29 == kEmpty);
      auVar17[0xd] = -(cVar30 == kEmpty);
      auVar17[0xe] = -(cVar31 == kEmpty);
      auVar17[0xf] = -(cVar32 == kEmpty);
      if ((((((((((((((((auVar17 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar17 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar17 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar17 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar17 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar17 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar17 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar17 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar17 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar17 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar32 == kEmpty)
      break;
      psVar1 = local_98.hash_of_arg + 2;
      local_98.this =
           (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            *)((long)local_98.hash_of_arg + (long)local_98.this + 0x10U & (ulong)local_98.key);
      local_98.hash_of_arg = psVar1;
      psVar10 = (size_t *)capacity(this);
      if (psVar10 < psVar1) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe37,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>, K = google::protobuf::(anonymous namespace)::ParentNumberQuery]"
                     );
      }
    }
  }
  AssertNotDebugCapacity(this);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = extraout_RDX;
  return (iterator)(auVar4 << 0x40);
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertOnFind(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }